

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

int thitmonst(monst *mon,obj *obj,obj *ostack)

{
  byte *pbVar1;
  permonst *ppVar2;
  boolean bVar3;
  schar sVar4;
  char cVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  monst *pmVar16;
  short sVar17;
  byte bVar18;
  ushort uVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  obj *in_stack_fffffffffffffea8;
  char local_138 [6];
  undefined8 uStack_132;
  undefined4 auStack_128 [62];
  
  uVar19 = obj->otyp;
  bVar18 = u.ustuck == mon & u._1052_1_;
  if ((((mon->data == mons + 0xdb) && ((mon->field_0x61 & 1) == 0)) && (1 < mon->mhp)) &&
     ((objects[(short)uVar19].oc_oprop != '\x04' && (bVar3 = obj_resists(obj,5,0x32), bVar3 == '\0')
      ))) {
    bVar3 = is_quest_artifact(obj);
    bVar21 = bVar3 == '\0';
  }
  else {
    bVar21 = false;
  }
  sVar17 = (short)u.uluck;
  sVar6 = (short)u.moreluck;
  iVar7 = find_mac(mon);
  iVar20 = u.ulevel;
  if (u.umonnum != u.umonster) {
    iVar20 = (int)(youmonst.data)->mlevel;
  }
  iVar20 = iVar7 + u.uhitinc + iVar20 + (int)(short)((short)(sVar6 + sVar17) / 3 + -1);
  sVar4 = acurr(3);
  if (sVar4 < '\x04') {
    iVar20 = iVar20 + -3;
  }
  else {
    sVar4 = acurr(3);
    if (sVar4 < '\x06') {
      iVar20 = iVar20 + -2;
    }
    else {
      sVar4 = acurr(3);
      if (sVar4 < '\b') {
        iVar20 = iVar20 + -1;
      }
      else {
        sVar4 = acurr(3);
        if ('\r' < sVar4) {
          sVar4 = acurr(3);
          iVar20 = iVar20 + sVar4 + -0xe;
        }
      }
    }
  }
  iVar8 = distmin((int)u.ux,(int)u.uy,(int)mon->mx,(int)mon->my);
  iVar7 = -4;
  if (-4 < 3 - iVar8) {
    iVar7 = 3 - iVar8;
  }
  iVar7 = iVar7 + iVar20;
  if ((uwep != (obj *)0x0 && uarmg != (obj *)0x0) && (objects[uwep->otyp].oc_subtyp == '\x16')) {
    switch(uarmg->otyp) {
    case 0x8f:
    case 0x92:
      break;
    case 0x90:
      iVar7 = iVar7 + -3;
      break;
    case 0x91:
      iVar7 = iVar7 + -2;
      break;
    default:
      warning("Unknown type of gloves (%d)",(ulong)(uint)(int)uarmg->otyp);
    }
  }
  iVar20 = omon_adj(mon,obj,'\x01');
  iVar20 = iVar20 + iVar7;
  uVar10 = mon->data->mflags2;
  if ((char)uVar10 < '\0') {
    if (u.umonnum == u.umonster) {
      if (urace.malenum == 0x111) {
LAB_0017e57b:
        iVar20 = iVar20 + 1;
      }
    }
    else if (((youmonst.data)->mflags2 & 0x10) != 0) goto LAB_0017e57b;
  }
  iVar7 = iVar20 + 1000;
  if (bVar18 == 0) {
    iVar7 = iVar20;
  }
  if (((obj->oclass != '\r') || ((uVar10 >> 0x1d & 1) == 0)) || (mon->data->mlet != '\x15')) {
    if (((obj->oartifact != '\0') && (bVar3 = is_quest_artifact(obj), bVar3 != '\0')) &&
       (mon->data->msound == '\x1f')) {
      uVar10 = *(uint *)&mon->field_0x60;
      *(uint *)&mon->field_0x60 = uVar10 & 0xfff7ffff;
      pbVar1 = (byte *)((long)&mon->mstrategy + 3);
      *pbVar1 = *pbVar1 & 0xcf;
      if ((uVar10 >> 0x12 & 1) == 0) {
        return 0;
      }
      pcVar12 = Monnam(mon);
      pcVar13 = xname(obj);
      pcVar13 = the(pcVar13);
      pline("%s catches %s.",pcVar12,pcVar13);
      if ((mon->field_0x62 & 0x40) != 0) {
        bVar3 = monnear(mon,(int)u.ux,(int)u.uy);
        finish_quest(obj);
        pcVar12 = Monnam(mon);
        pcVar13 = "hands";
        if (bVar3 == '\0') {
          pcVar13 = "tosses";
        }
        pcVar15 = xname(obj);
        pcVar15 = the(pcVar15);
        pline("%s %s %s back to you.",pcVar12,pcVar13,pcVar15);
        if (bVar3 == '\0') {
          iVar20 = sgn((int)mon->mx - (int)u.ux);
          iVar7 = sgn((int)mon->my - (int)u.uy);
          sho_obj_return_to_u(obj,(schar)iVar20,(schar)iVar7);
        }
        addinv(in_stack_fffffffffffffea8);
        encumber_msg();
        return 1;
      }
      mpickobj(mon,obj);
      return 1;
    }
    cVar5 = obj->oclass;
    if ((cVar5 == '\x02') || (cVar5 == '\r')) {
      if (2 < (byte)(objects[obj->otyp].oc_subtyp + 0x18U)) goto LAB_0017e8c5;
      if ((((cVar5 == '\r') || (cVar5 == '\x02')) && (uwep != (obj *)0x0)) &&
         ((int)objects[obj->otyp].oc_subtyp + (int)objects[uwep->otyp].oc_subtyp == 0)) {
        cVar5 = uwep->spe;
        uVar9 = *(uint *)&uwep->field_0x4a >> 8 & 3;
        uVar10 = *(uint *)&uwep->field_0x4a >> 10 & 3;
        if (uVar10 < uVar9) {
          uVar10 = uVar9;
        }
        iVar20 = weapon_hit_bonus(uwep);
        iVar7 = (iVar7 + iVar20 + cVar5) - uVar10;
        if (uwep->oartifact != '\0') {
          iVar20 = spec_abon(uwep,mon);
          iVar7 = iVar20 + iVar7;
        }
        iVar20 = iVar7;
        if (((urole.malenum == 0x165 || urace.malenum == 0x111) &&
            ((u.umonnum == u.umonster || (((youmonst.data)->mflags2 & (int)urace.selfmask) != 0))))
           && (sVar6 = uwep->otyp, objects[sVar6].oc_subtyp == '\x16')) {
          if (sVar6 == 0x43 && urace.malenum == 0x111) {
            iVar20 = iVar7 + 2;
          }
          else {
            iVar20 = iVar7 + 1;
            if ((urole.malenum == 0x165) && (sVar6 == 0x45)) {
              iVar20 = iVar7 + 2;
            }
          }
        }
      }
      else {
        iVar20 = iVar7 + -4;
      }
    }
    else {
      if ((cVar5 != '\x06') || (objects[obj->otyp].oc_subtyp == '\0')) {
        if (((uVar19 - 0x218 < 2) || (uVar19 == 0x10f)) || (uVar19 == 0x120)) {
          if (bVar18 != 0) {
LAB_0017ea2b:
            hmon(mon,obj,ostack,'\x01');
            return 1;
          }
          sVar4 = acurr(3);
          iVar20 = rnd(0x19);
          if (iVar20 < sVar4) goto LAB_0017ea2b;
          cVar5 = obj->oclass;
          if (cVar5 == '\b') goto LAB_0017ec9e;
        }
        else {
          if (uVar19 == 0x214) {
            exercise(0,'\x01');
            iVar20 = rnd(0x14);
            if (iVar20 <= iVar7) {
              exercise(3,'\x01');
              hmon(mon,obj,ostack,'\x01');
              if (bVar21) {
                if (u.ushops[0] != '\0') {
                  check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
                }
                obfree(obj,(obj *)0x0);
                return 1;
              }
              return 0;
            }
LAB_0017ec81:
            tmiss(obj,mon);
            return 0;
          }
          if (uVar19 == 0x216) {
            exercise(0,'\x01');
            iVar20 = rnd(0x14);
            if (iVar7 < iVar20) goto LAB_0017ec81;
            exercise(3,'\x01');
            bVar3 = hmon(mon,obj,ostack,'\x01');
            if ((((bVar3 == '\0' & bVar18) == 1) && ((u._1052_1_ & 1) == 0)) && (uball == obj)) {
              return 1;
            }
            if (!bVar21) {
              return 0;
            }
            goto joined_r0x0017eb6b;
          }
          if (cVar5 == '\b') {
            if (bVar18 != 0) goto LAB_0017ecb9;
LAB_0017ec9e:
            sVar4 = acurr(3);
            iVar20 = rnd(0x19);
            if (iVar20 < sVar4) {
LAB_0017ecb9:
              potionhit(mon,obj,'\x01');
              return 1;
            }
            cVar5 = obj->oclass;
          }
        }
        if ((cVar5 == '\a') &&
           ((ppVar2 = mon->data, (ppVar2->mflags2 & 0x400000) != 0 ||
            ((urole.malenum == 0x15d &&
             (ppVar2 == mons + 0x5f ||
              ((ppVar2 == mons + 0x5e || ppVar2 == mons + 0x5c) ||
              (ppVar2 == mons + 0x5b || ppVar2 == mons + 0x5a)))))))) goto LAB_0017ee56;
        if (mon->mtame != '\0') {
          iVar20 = dogfood(mon,obj);
          if (iVar20 < 3) goto LAB_0017ee56;
          cVar5 = obj->oclass;
        }
        if (cVar5 == '\a') {
          if (urole.malenum == 0x164) {
            if (mon->data != mons + 0xef) goto LAB_0017f1b1;
            if ((obj->otyp == 0x11a) || (uVar10 = mt_random(), (uVar10 & 1) == 0))
            goto LAB_0017ee56;
          }
          if ((urole.malenum == 0x15b) || (urole.malenum == 0x163)) {
            if (mon->data == mons + 0x19) goto LAB_0017ee56;
          }
          else if ((urole.malenum == 0x166) &&
                  (mon->data == mons + 0x152 || mon->data == mons + 0x156)) {
LAB_0017ee56:
            pmVar16 = tamedog(mon,obj);
            if (pmVar16 == (monst *)0x0) {
              pcVar12 = xname(obj);
              miss(pcVar12,mon);
              mon->field_0x62 = mon->field_0x62 & 0xf7;
              pbVar1 = (byte *)((long)&mon->mstrategy + 3);
              *pbVar1 = *pbVar1 & 0xcf;
              return 0;
            }
            return 1;
          }
        }
LAB_0017f1b1:
        if (bVar18 != 0) {
          wakeup(mon);
          if ((((obj->otyp == 0x10e) && (obj->corpsenm - 0xbU < 2)) &&
              (((u.ustuck)->data->mflags1 & 0x40000) != 0)) &&
             (minstapetrify(u.ustuck,'\x01'), (u._1052_1_ & 1) == 0)) {
            delobj(obj);
            return 1;
          }
          pcVar12 = Tobjnam(obj,"vanish");
          pcVar13 = mon_nam(mon);
          pcVar13 = s_suffix(pcVar13);
          pcVar15 = "entrails";
          if (((u.ustuck)->data->mflags1 >> 0x12 & 1) == 0) {
            pcVar15 = "currents";
          }
          pline("%s into %s %s.",pcVar12,pcVar13,pcVar15);
          return 0;
        }
        goto LAB_0017e915;
      }
LAB_0017e8c5:
      if (uVar19 == 9) {
        iVar20 = 4;
      }
      else {
        bVar3 = throwing_weapon(obj);
        iVar20 = (uint)(bVar3 != '\0') * 4 + -2;
      }
      iVar8 = weapon_hit_bonus(obj);
      iVar20 = iVar8 + iVar20 + iVar7;
    }
    iVar7 = rnd(0x14);
    if (iVar20 < iVar7) {
LAB_0017e915:
      tmiss(obj,mon);
      return 0;
    }
    bVar3 = hmon(mon,obj,ostack,'\x01');
    if (bVar3 != '\0') {
      cutworm(mon,bhitpos.x,bhitpos.y,obj);
    }
    exercise(3,'\x01');
    bVar3 = detonate_obj(obj,ostack,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
    if (bVar3 != '\0') {
      return 1;
    }
    if (((byte)objects[(short)uVar19].oc_subtyp < 0xe7) ||
       (((objects[(short)uVar19].oc_subtyp == 0xe8 && (uVar10 = mt_random(), (uVar10 & 1) == 0)) ||
        ((objects[(short)uVar19].field_0x10 & 0x10) != 0)))) {
      bVar22 = false;
    }
    else {
      uVar9 = *(uint *)&obj->field_0x4a >> 8 & 3;
      uVar10 = *(uint *)&obj->field_0x4a >> 10 & 3;
      if (uVar10 < uVar9) {
        uVar10 = uVar9;
      }
      iVar20 = uVar10 - (int)obj->spe;
      if (iVar20 < -1) {
        uVar10 = mt_random();
        uVar10 = (uint)((uVar10 & 3) == 0);
      }
      else {
        uVar10 = rn2(iVar20 + 3);
      }
      if ((obj->field_0x4a & 2) != 0) {
        uVar9 = mt_random();
        uVar9 = uVar9 & 3;
        if (((int)u.moreluck + (int)u.uluck == 0) ||
           (iVar20 = rn2(0x32 - ((int)u.moreluck + (int)u.uluck)), iVar20 == 0)) {
LAB_0017f16c:
          if (uVar9 != 0) goto LAB_0017f173;
        }
        else {
          uVar11 = (int)u.moreluck + (int)u.uluck;
          if (-6 < (int)uVar11) {
            uVar11 = (uint)(short)((int)((uint)(ushort)((short)uVar11 >> 0xf) << 0x10 |
                                        uVar11 & 0xffff) / 3);
          }
          uVar9 = uVar9 - uVar11;
          if (-1 < (int)uVar9) {
            if (2 < uVar9) {
              uVar9 = 3;
            }
            goto LAB_0017f16c;
          }
        }
        uVar10 = 0;
      }
LAB_0017f173:
      bVar22 = uVar10 != 0;
    }
    if (!(bool)(bVar21 | bVar22)) {
      passive_obj(mon,obj,(attack *)0x0);
      return 0;
    }
joined_r0x0017eb6b:
    if (u.ushops[0] != '\0') {
      check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
    }
    obfree(obj,(obj *)0x0);
    return 1;
  }
  cVar5 = mon->mtame;
  pcVar12 = Monnam(mon);
  pcVar13 = xname(obj);
  pcVar13 = the(pcVar13);
  if (cVar5 != '\0') {
    pline("%s catches and drops %s.",pcVar12,pcVar13);
    return 0;
  }
  pline("%s catches %s.",pcVar12,pcVar13);
  iVar20 = sgn((int)mon->data->maligntyp);
  iVar7 = sgn((int)u.ualign.type);
  uVar19 = *(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0;
  pcVar12 = Monnam(mon);
  strcpy(local_138,pcVar12);
  *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffbf7fff | 0x400000;
  if (((obj->field_0x4a & 0x20) == 0) || ((objects[obj->otyp].field_0x10 & 1) == 0)) {
    if ((obj->onamelth == '\0') && (objects[obj->otyp].oc_uname == (char *)0x0)) {
      sVar14 = strlen(local_138);
      pcVar12 = local_138 + sVar14;
      if (uVar19 == 0x140) {
        if (iVar20 == iVar7) {
          builtin_strncpy(local_138 + sVar14," gratefu",8);
          *(undefined4 *)((long)&uStack_132 + sVar14 + 2) = 0x796c6c;
          sVar4 = '\x01';
        }
        else {
LAB_0017eed3:
          builtin_strncpy(pcVar12," hesitatingly",0xe);
          uVar10 = mt_random();
          sVar4 = (char)((ulong)uVar10 % 3) + -1;
        }
        goto LAB_0017f071;
      }
      builtin_strncpy(local_138 + sVar14," graciou",8);
      *(undefined4 *)((long)&uStack_132 + sVar14 + 2) = 0x796c73;
    }
    else {
      sVar14 = strlen(local_138);
      pcVar12 = local_138 + sVar14;
      if (uVar19 != 0x140) goto LAB_0017ed16;
      if (iVar20 != iVar7) goto LAB_0017eed3;
      builtin_strncpy(local_138 + sVar14," gratefu",8);
      *(undefined4 *)((long)&uStack_132 + sVar14 + 2) = 0x796c6c;
      sVar4 = '\x02';
LAB_0017f071:
      change_luck(sVar4);
    }
    sVar14 = strlen(local_138);
    builtin_strncpy(local_138 + sVar14," accepts",8);
    builtin_strncpy((char *)((long)&uStack_132 + sVar14 + 2)," your gi",8);
    *(undefined4 *)((long)auStack_128 + sVar14) = 0x2e7466;
    if (u.ushops[0] != '\0') {
      check_shop_obj(obj,mon->mx,mon->my,'\x01');
    }
    mpickobj(mon,obj);
    iVar20 = 1;
  }
  else {
    sVar14 = strlen(local_138);
    pcVar12 = local_138 + sVar14;
    if (uVar19 == 0x140) {
      if (iVar20 == iVar7) {
        builtin_strncpy(local_138 + sVar14," gratefu",8);
        *(undefined4 *)((long)&uStack_132 + sVar14 + 2) = 0x796c6c;
        sVar4 = '\x05';
      }
      else {
        *(undefined8 *)((long)&uStack_132 + sVar14) = 0x796c676e697461;
        builtin_strncpy(local_138 + sVar14," hesitat",8);
        uVar10 = mt_random();
        sVar4 = (char)((ulong)uVar10 % 7) + -3;
      }
      goto LAB_0017f071;
    }
LAB_0017ed16:
    builtin_strncpy(pcVar12," is not interested in your junk.",0x21);
    iVar20 = 0;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017f0da;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017f0d5;
  }
  else {
LAB_0017f0d5:
    if (ublindf == (obj *)0x0) goto LAB_0017f113;
LAB_0017f0da:
    if (ublindf->oartifact != '\x1d') goto LAB_0017f113;
  }
  pline("%s",local_138);
LAB_0017f113:
  bVar3 = tele_restrict(mon);
  if (bVar3 == '\0') {
    rloc(level,mon,'\0');
    return iVar20;
  }
  return iVar20;
}

Assistant:

int thitmonst(struct monst *mon, struct obj *obj, struct obj *ostack)
{
	int	tmp; /* Base chance to hit */
	int	disttmp; /* distance modifier */
	int otyp = obj->otyp;
	boolean guaranteed_hit = (u.uswallow && mon == u.ustuck);
	boolean obj_disint = (touch_disintegrates(mon->data) &&
			      !mon->mcan &&
			      (mon->mhp > 1) &&
			      !oresist_disintegration(obj));

	/* Differences from melee weapons:
	 *
	 * Dex still gives a bonus, but strength does not.
	 * Polymorphed players lacking attacks may still throw.
	 * There's a base -1 to hit.
	 * No bonuses for fleeing or stunned targets (they don't dodge
	 *    melee blows as readily, but dodging arrows is hard anyway).
	 * Not affected by traps, etc.
	 * Certain items which don't in themselves do damage ignore tmp.
	 * Distance and monster size affect chance to hit.
	 */
	tmp = -1 + Luck / 3 + find_mac(mon) + u.uhitinc +
			maybe_polyd(youmonst.data->mlevel, u.ulevel);
	if (ACURR(A_DEX) < 4) tmp -= 3;
	else if (ACURR(A_DEX) < 6) tmp -= 2;
	else if (ACURR(A_DEX) < 8) tmp -= 1;
	else if (ACURR(A_DEX) >= 14) tmp += (ACURR(A_DEX) - 14);

	/* Modify to-hit depending on distance; but keep it sane.
	 * Polearms get a distance penalty even when wielded; it's
	 * hard to hit at a distance.
	 */
	disttmp = 3 - distmin(u.ux, u.uy, mon->mx, mon->my);
	if (disttmp < -4) disttmp = -4;
	tmp += disttmp;

	/* gloves are a hinderance to proper use of bows */
	if (uarmg && uwep && objects[uwep->otyp].oc_skill == P_BOW) {
	    switch (uarmg->otyp) {
	    case GAUNTLETS_OF_POWER:    /* metal */
		tmp -= 2;
		break;
	    case GAUNTLETS_OF_FUMBLING:
		tmp -= 3;
		break;
	    case LEATHER_GLOVES:
	    case GAUNTLETS_OF_DEXTERITY:
		break;
	    default:
		warning("Unknown type of gloves (%d)", uarmg->otyp);
		break;
	    }
	}

	tmp += omon_adj(mon, obj, TRUE);
	if (is_orc(mon->data) && maybe_polyd(is_elf(youmonst.data),
			Race_if (PM_ELF)))
	    tmp++;
	if (guaranteed_hit) {
	    tmp += 1000; /* Guaranteed hit */
	}

	if (obj->oclass == GEM_CLASS && is_unicorn(mon->data)) {
	    if (mon->mtame) {
		pline("%s catches and drops %s.", Monnam(mon), the(xname(obj)));
		return 0;
	    } else {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		return gem_accept(mon, obj);
	    }
	}

	/* don't make game unwinnable if naive player throws artifact
	   at leader.... */
	if (quest_arti_hits_leader(obj, mon)) {
	    /* not wakeup(), which angers non-tame monsters */
	    mon->msleeping = 0;
	    mon->mstrategy &= ~STRAT_WAITMASK;

	    if (mon->mcanmove) {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		if (mon->mpeaceful) {
		    boolean next2u = monnear(mon, u.ux, u.uy);

		    finish_quest(obj);	/* acknowledge quest completion */
		    pline("%s %s %s back to you.", Monnam(mon),
			  (next2u ? "hands" : "tosses"), the(xname(obj)));
		    if (!next2u) {
			schar dx = sgn(mon->mx - u.ux);
			schar dy = sgn(mon->my - u.uy);
			sho_obj_return_to_u(obj, dx, dy);
		    }
		    addinv(obj);	/* back into your inventory */
		    encumber_msg();
		} else {
		    /* angry leader caught it and isn't returning it */
		    mpickobj(mon, obj);
		}
		return 1;		/* caller doesn't need to place it */
	    }
	    return 0;
	}

	if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
		obj->oclass == GEM_CLASS) {
	    if (is_ammo(obj)) {
		if (!ammo_and_launcher(obj, uwep)) {
		    tmp -= 4;
		} else {
		    tmp += uwep->spe - greatest_erosion(uwep);
		    tmp += weapon_hit_bonus(uwep);
		    if (uwep->oartifact) tmp += spec_abon(uwep, mon);
		    /*
		     * Elves and Samurais are highly trained w/bows,
		     * especially their own special types of bow.
		     * Polymorphing won't make you a bow expert.
		     */
		    if ((Race_if (PM_ELF) || Role_if(PM_SAMURAI)) &&
				(!Upolyd || your_race(youmonst.data)) &&
				objects[uwep->otyp].oc_skill == P_BOW) {
			tmp++;
			if (Race_if (PM_ELF) && uwep->otyp == ELVEN_BOW)
			    tmp++;
			else if (Role_if (PM_SAMURAI) && uwep->otyp == YUMI)
			    tmp++;
		    }
		}
	    } else {
		if (otyp == BOOMERANG)		/* arbitrary */
		    tmp += 4;
		else if (throwing_weapon(obj))	/* meant to be thrown */
		    tmp += 2;
		else				/* not meant to be thrown */
		    tmp -= 2;
		/* we know we're dealing with a weapon or weptool handled
		   by WEAPON_SKILLS once ammo objects have been excluded */
		tmp += weapon_hit_bonus(obj);
	    }

	    if (tmp >= rnd(20)) {
		int broken = FALSE;
		if (hmon(mon, obj, ostack, TRUE)) {	/* mon still alive */
		    cutworm(mon, bhitpos.x, bhitpos.y, obj);
		}
		exercise(A_DEX, TRUE);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return 1;
		/* projectiles other than shuriken, crossbow bolts (half the
		   time) and magic stones sometimes disappear when thrown */
		if (objects[otyp].oc_skill < P_NONE &&
				objects[otyp].oc_skill > -P_BOOMERANG &&
				objects[otyp].oc_skill != -P_SHURIKEN &&
				!(objects[otyp].oc_skill == -P_CROSSBOW && !rn2(2)) &&
				!objects[otyp].oc_magic) {
		    /* we were breaking 2/3 of everything unconditionally.
		     * we still don't want anything to survive unconditionally,
		     * but we need ammo to stay around longer on average.
		     */
		    int chance;
		    chance = 3 + greatest_erosion(obj) - obj->spe;
		    if (chance > 1)
			broken = rn2(chance);
		    else
			broken = !rn2(4);
		    if (obj->blessed && !rnl(4))
			broken = 0;
		}
		if (broken || obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
		passive_obj(mon, obj, NULL);
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == HEAVY_IRON_BALL) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		int was_swallowed = guaranteed_hit;

		exercise(A_DEX, TRUE);
		if (!hmon(mon, obj, ostack, TRUE)) {	/* mon killed */
		    if (was_swallowed && !u.uswallow && obj == uball)
			return 1;	/* already did placebc() */
		}

		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == BOULDER) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		exercise(A_DEX, TRUE);
		hmon(mon, obj, ostack, TRUE);
		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if ((otyp == EGG || otyp == CREAM_PIE ||
		    otyp == BLINDING_VENOM || otyp == ACID_VENOM) &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    hmon(mon, obj, ostack, TRUE);
	    return 1;	/* hmon used it up */

	} else if (obj->oclass == POTION_CLASS &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    potionhit(mon, obj, TRUE);
	    return 1;

	} else if (befriend_with_obj(mon->data, obj) ||
		   (mon->mtame && dogfood(mon, obj) <= ACCFOOD) ||
		   (obj->oclass == FOOD_CLASS &&
		    ((Role_if(PM_ROGUE) &&
		       mon->data == &mons[PM_MONKEY] &&
		      (obj->otyp == BANANA || !rn2(2))) ||
		     (Role_if(PM_TOURIST) &&
		      (mon->data == &mons[PM_CROCODILE] ||
		       mon->data == &mons[PM_BABY_CROCODILE])) ||
		     ((Role_if(PM_RANGER) || Role_if(PM_CAVEMAN)) &&
		       mon->data == &mons[PM_WINTER_WOLF_CUB])))) {
	    if (tamedog(mon, obj))
		return 1;           	/* obj is gone */
	    else {
		/* not tmiss(), which angers non-tame monsters */
		miss(xname(obj), mon);
		mon->msleeping = 0;
		mon->mstrategy &= ~STRAT_WAITMASK;
	    }
	} else if (guaranteed_hit) {
	    /* this assumes that guaranteed_hit is due to swallowing */
	    wakeup(mon);
	    if (obj->otyp == CORPSE && touch_petrifies(&mons[obj->corpsenm])) {
		if (is_animal(u.ustuck->data)) {
			minstapetrify(u.ustuck, TRUE);
			/* Don't leave a cockatrice corpse available in a statue */
			if (!u.uswallow) {
				delobj(obj);
				return 1;
			}
	    	}
	    }
	    pline("%s into %s %s.",
		Tobjnam(obj, "vanish"), s_suffix(mon_nam(mon)),
		is_animal(u.ustuck->data) ? "entrails" : "currents");
	} else {
	    tmiss(obj, mon);
	}

	return 0;
}